

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void right_side(int row,int left,int right_mark,char *limits)

{
  bool bVar1;
  int row_00;
  int local_5c;
  int local_54;
  char *pcStack_50;
  int lim_max;
  char *row_max;
  char *row_min;
  char *rowp;
  int i;
  int result;
  int deeper;
  int nrow;
  int right_edge;
  int right;
  char *limits_local;
  int local_10;
  int right_mark_local;
  int left_local;
  int row_local;
  
  pcStack_50 = (char *)0x0;
  row_max = (char *)0x0;
  row_min = (char *)0x0;
  row_00 = row + step;
  bVar1 = false;
  if (((-1 < row_00) && (bVar1 = false, row_00 < 0x15)) && (bVar1 = true, limits != (char *)0x0)) {
    bVar1 = limits[1] <= *limits;
  }
  if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
    row_min = cs_rows[row];
    row_max = cs_left + row;
    pcStack_50 = cs_right + row;
  }
  limits_local._4_4_ = right_mark;
  local_10 = left;
  if (limits == (char *)0x0) {
    local_54 = 0x4f;
    _right_edge = (char *)0x0;
  }
  else {
    local_54 = start_col + *limits;
    if (0x4f < local_54) {
      local_54 = 0x4f;
    }
    if (local_54 < right_mark) {
      limits_local._4_4_ = local_54;
    }
    _right_edge = limits + 1;
  }
  do {
    while( true ) {
      while( true ) {
        if (limits_local._4_4_ < local_10) {
          return;
        }
        deeper = (int)right_ptrs[row][local_10];
        if (local_54 < deeper) {
          deeper = local_54;
        }
        if (viz_clear_rows[row][local_10] != '\0') break;
        if (limits_local._4_4_ < deeper) {
          if (viz_clear_rows[row - step][limits_local._4_4_] == '\0') {
            local_5c = limits_local._4_4_;
          }
          else {
            local_5c = limits_local._4_4_ + 1;
          }
          deeper = local_5c;
        }
        if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
          for (rowp._0_4_ = local_10; (int)rowp <= deeper; rowp._0_4_ = (int)rowp + 1) {
            row_min[(int)rowp] = '\x01';
          }
          if (local_10 < *row_max) {
            *row_max = (char)local_10;
          }
          if (*pcStack_50 < deeper) {
            *pcStack_50 = (char)deeper;
          }
        }
        else {
          for (rowp._0_4_ = local_10; (int)rowp <= deeper; rowp._0_4_ = (int)rowp + 1) {
            (*vis_func)((int)rowp,row,varg);
          }
        }
        local_10 = deeper + 1;
      }
      if (local_10 != start_col) break;
LAB_003344d7:
      if (limits_local._4_4_ < deeper) {
        for (nrow = limits_local._4_4_; nrow <= deeper; nrow = nrow + 1) {
          if (step < 0) {
            rowp._4_4_ = q1_path(start_row,start_col,row,nrow);
          }
          else {
            rowp._4_4_ = q4_path(start_row,start_col,row,nrow);
          }
          if (rowp._4_4_ == 0) break;
        }
        nrow = nrow + -1;
      }
      else {
        nrow = deeper;
      }
      if (local_10 <= nrow) {
        if (((local_10 == nrow) && (local_10 == start_col)) &&
           ((start_col < 0x4f && (viz_clear_rows[row][start_col + 1] == '\0')))) {
          nrow = start_col + 1;
        }
        if (local_54 < nrow) {
          nrow = local_54;
        }
        if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
          for (rowp._0_4_ = local_10; (int)rowp <= nrow; rowp._0_4_ = (int)rowp + 1) {
            row_min[(int)rowp] = '\x01';
          }
          if (local_10 < *row_max) {
            *row_max = (char)local_10;
          }
          if (*pcStack_50 < nrow) {
            *pcStack_50 = (char)nrow;
          }
        }
        else {
          for (rowp._0_4_ = local_10; (int)rowp <= nrow; rowp._0_4_ = (int)rowp + 1) {
            (*vis_func)((int)rowp,row,varg);
          }
        }
        if (bVar1) {
          right_side(row_00,local_10,nrow,_right_edge);
        }
        local_10 = nrow + 1;
      }
    }
    for (; local_10 <= deeper; local_10 = local_10 + 1) {
      if (step < 0) {
        rowp._4_4_ = q1_path(start_row,start_col,row,local_10);
      }
      else {
        rowp._4_4_ = q4_path(start_row,start_col,row,local_10);
      }
      if (rowp._4_4_ != 0) break;
    }
    if (local_54 < local_10) {
      return;
    }
    if (local_10 == local_54) {
      if (vis_func != (_func_void_int_int_void_ptr *)0x0) {
        (*vis_func)(local_54,row,varg);
        return;
      }
      row_min[local_54] = '\x01';
      if (local_54 <= *pcStack_50) {
        return;
      }
      *pcStack_50 = (char)local_54;
      return;
    }
    if (local_10 < deeper) goto LAB_003344d7;
    local_10 = deeper;
  } while( true );
}

Assistant:

static void right_side(
    int row,		/* current row */
    int left,		/* first (left side) visible spot on prev row */
    int right_mark,	/* last (right side) visible spot on prev row */
    const char *limits)	/* points at range limit for current row, or NULL */
{
    int		  right;	/* right limit of "could see" */
    int		  right_edge;	/* right edge of an opening */
    int		  nrow;		/* new row (calculate once) */
    int		  deeper;	/* if TRUE, call self as needed */
    int		  result;	/* set by q?_path() */
    int  i;		/* loop counter */
    char *rowp;	/* row optimization */
    char	  *row_min;	/* left most  [used by macro set_min()] */
    char	  *row_max;	/* right most [used by macro set_max()] */
    int		  lim_max;	/* right most limit of circle */

    rowp = row_min = row_max = 0;
    nrow    = row + step;
    /*
     * Can go deeper if the row is in bounds and the next row is within
     * the circle's limit.  We tell the latter by checking to see if the next
     * limit value is the start of a new circle radius (meaning we depend
     * on the structure of circle_data[]).
     */
    deeper  = good_row(nrow) && (!limits || (*limits >= *(limits+1)));
    if (!vis_func) {
	rowp    = cs_rows[row];	/* optimization */
	row_min = &cs_left[row];
	row_max = &cs_right[row];
    }
    if (limits) {
	lim_max = start_col + *limits;
	if (lim_max > COLNO-1) lim_max = COLNO-1;
	if (right_mark > lim_max) right_mark = lim_max;
	limits++; /* prepare for next row */
    } else
	lim_max = COLNO-1;

    while (left <= right_mark) {
	right_edge = right_ptrs[row][left];
	if (right_edge > lim_max) right_edge = lim_max;

	if (!is_clear(row,left)) {
	    /*
	     * Jump to the far side of a stone wall.  We can set all
	     * the points in between as seen.
	     *
	     * If the right edge goes beyond the right mark, check to see
	     * how much we can see.
	     */
	    if (right_edge > right_mark) {
		/*
		 * If the mark on the previous row was a clear position,
		 * the odds are that we can actually see part of the wall
		 * beyond the mark on this row.  If so, then see one beyond
		 * the mark.  Otherwise don't.  This is a kludge so corners
		 * with an adjacent doorway show up.
		 */
		right_edge = is_clear(row-step,right_mark) ?
						    right_mark+1 : right_mark;
	    }
	    if (vis_func) {
		for (i = left; i <= right_edge; i++) (*vis_func)(i, row, varg);
	    } else {
		for (i = left; i <= right_edge; i++) set_cs(rowp,i);
		set_min(left);      set_max(right_edge);
	    }
	    left = right_edge + 1; /* no limit check necessary */
	    continue;
	}

	/* No checking needed if our left side is the start column. */
	if (left != start_col) {
	    /*
	     * Find the left side.  Move right until we can see it or we run
	     * into a wall.
	     */
	    for (; left <= right_edge; left++) {
		if (step < 0) {
		    result = q1_path(start_row,start_col,row,left);
		} else {
		    result = q4_path(start_row,start_col,row,left);
		}
		if (result) break;
	    }

	    /*
	     * Check for boundary conditions.  We *need* check (2) to break
	     * an infinite loop where:
	     *
	     *		left == right_edge == right_mark == lim_max.
	     *
	     */
	    if (left > lim_max) return;	/* check (1) */
	    if (left == lim_max) {	/* check (2) */
		if (vis_func) (*vis_func)(lim_max, row, varg);
		else {
		    set_cs(rowp,lim_max);
		    set_max(lim_max);
		}
		return;
	    }
	    /*
	     * Check if we can see any spots in the opening.  We might
	     * (left == right_edge) or might not (left == right_edge+1) have
	     * been able to see the far wall.  Make sure we *can* see the
	     * wall (remember, we can see the spot above/below this one)
	     * by backing up.
	     */
	    if (left >= right_edge) {
		left = right_edge;	/* for the case left == right_edge+1 */
		continue;
	    }
	}

	/*
	 * Find the right side.  If the marker from the previous row is
	 * closer than the edge on this row, then we have to check
	 * how far we can see around the corner (under the overhang).  Stop
	 * at the first non-visible spot or we actually hit the far wall.
	 *
	 * Otherwise, we know we can see the right edge of the current row.
	 *
	 * This must be a strict less than so that we can always see a
	 * horizontal wall, even if it is adjacent to us.
	 */
	if (right_mark < right_edge) {
	    for (right = right_mark; right <= right_edge; right++) {
		if (step < 0) {
		    result = q1_path(start_row,start_col,row,right);
		} else {
		    result = q4_path(start_row,start_col,row,right);
		}
		if (!result) break;
	    }
	    --right;	/* get rid of the last increment */
	}
	else
	    right = right_edge;

	/*
	 * We have the range that we want.  Set the bits.  Note that
	 * there is no else --- we no longer handle splinters.
	 */
	if (left <= right) {
	    /*
	     * An ugly special case.  If you are adjacent to a vertical wall
	     * and it has a break in it, then the right mark is set to be
	     * start_col.  We *want* to be able to see adjacent vertical
	     * walls, so we have to set it back.
	     */
	    if (left == right && left == start_col &&
			start_col < (COLNO-1) && !is_clear(row,start_col+1))
		right = start_col+1;

	    if (right > lim_max) right = lim_max;
	    /* set the bits */
	    if (vis_func)
		for (i = left; i <= right; i++) (*vis_func)(i, row, varg);
	    else {
		for (i = left; i <= right; i++) set_cs(rowp,i);
		set_min(left);      set_max(right);
	    }

	    /* recursive call for next finger of light */
	    if (deeper) right_side(nrow,left,right,limits);
	    left = right + 1; /* no limit check necessary */
	}
    }
}